

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardwarex.cpp
# Opt level: O2

int RecvDataMDMx(MDM *pMDM,uchar *buf,int buflen,int *pReceivedBytes)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (pMDM->InternalBufferSize < buflen) {
    pcVar3 = "Too many data to receive at once. ";
  }
  else {
    iVar1 = ReadRS232Port(&pMDM->RS232Port,buf,buflen,pReceivedBytes);
    if (iVar1 == 0) {
      return 0;
    }
    pcVar3 = "Error receiving data with a MDM. ";
  }
  pcVar2 = strtime_m();
  printf("RecvDataMDM error (%s) : %s(pMDM=%#x)\n",pcVar2,pcVar3,(ulong)pMDM & 0xffffffff);
  return 1;
}

Assistant:

HARDWAREX_API int RecvDataMDMx(MDM* pMDM, unsigned char* buf, int buflen, int* pReceivedBytes)
{
	return RecvDataMDM(pMDM, buf, buflen, pReceivedBytes);
}